

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void libcmepoll_LTX_select_shutdown(CMtrans_services_conflict svc,CManager cm,void *client_data)

{
  pthread_t *ppVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  long *in_RDX;
  long in_RDI;
  select_data_ptr sd;
  select_data_ptr *sdp;
  
  ppVar1 = (pthread_t *)*in_RDX;
  (**(code **)(in_RDI + 0x38))(ppVar1[6],0xc,"CMSelect Shutdown task called");
  pVar2 = *ppVar1;
  pVar3 = pthread_self();
  if (pVar2 != pVar3) {
    *(undefined4 *)(ppVar1 + 5) = 1;
    close((int)ppVar1[1]);
    wake_server_thread((select_data_ptr)0x102dde);
  }
  return;
}

Assistant:

extern void
libcmepoll_LTX_select_shutdown(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMSelectVerbose, "CMSelect Shutdown task called");
    if (sd->server_thread != thr_thread_self()) {
	sd->closed = 1;
	close(sd->epfd);
	wake_server_thread(sd);
    }
}